

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache.cpp
# Opt level: O1

void __thiscall
QOpenGLTextureGlyphCache::fillTexture
          (QOpenGLTextureGlyphCache *this,Coord *c,glyph_t glyph,QFixedPoint *subPixelPosition)

{
  QOpenGLContext *ctx;
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = (QOpenGLContext *)QOpenGLContext::currentContext();
  if (ctx == (QOpenGLContext *)0x0) {
    fillTexture();
  }
  else {
    if (*(char *)(*(long *)(ctx + 8) + 0xfc) == '\x01') {
      QImageTextureGlyphCache::fillTexture((Coord *)this,(uint)c,(QFixedPoint *)(ulong)glyph);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        load_glyph_image_region_to_texture
                  (ctx,(QImage *)&this->field_0xa0,c->x,c->y,c->w,c->h,
                   this->m_textureResource->m_texture,c->x,c->y);
        return;
      }
      goto LAB_0016308e;
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QTextureGlyphCache::textureMapForGlyph((uint)&local_58,(QFixedPoint *)this);
    load_glyph_image_to_texture
              (ctx,(QImage *)&local_58,this->m_textureResource->m_texture,c->x,c->y);
    QImage::~QImage((QImage *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0016308e:
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureGlyphCache::fillTexture(const Coord &c,
                                           glyph_t glyph,
                                           const QFixedPoint &subPixelPosition)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (ctx == nullptr) {
        qWarning("QOpenGLTextureGlyphCache::fillTexture: Called with no context");
        return;
    }

    if (ctx->d_func()->workaround_brokenFBOReadBack) {
        QImageTextureGlyphCache::fillTexture(c, glyph, subPixelPosition);
        load_glyph_image_region_to_texture(ctx, image(), c.x, c.y, c.w, c.h, m_textureResource->m_texture, c.x, c.y);
        return;
    }

    QImage mask = textureMapForGlyph(glyph, subPixelPosition);
    load_glyph_image_to_texture(ctx, mask, m_textureResource->m_texture, c.x, c.y);
}